

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

uint __thiscall
ON_OutlineFigure::GetPolyline
          (ON_OutlineFigure *this,double tolerance,
          _func_void_float_float_void_ptr *PointCallbackFunc,void *context)

{
  ON_OutlineFigurePoint *pOVar1;
  uint uVar2;
  double local_b8;
  uint local_9c;
  ON_2fPoint OStack_98;
  uint i;
  ON_2fPoint bez_cv [4];
  double default_tolerance;
  Internal_OutlineFigureToPolyline tp;
  uint c;
  ON_OutlineFigurePoint *a;
  void *context_local;
  _func_void_float_float_void_ptr *PointCallbackFunc_local;
  double tolerance_local;
  ON_OutlineFigure *this_local;
  
  if (PointCallbackFunc == (_func_void_float_float_void_ptr *)0x0) {
    this_local._4_4_ = 0.0;
  }
  else {
    pOVar1 = ON_SimpleArray<ON_OutlineFigurePoint>::Array(&this->m_points);
    tp._36_4_ = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this->m_points);
    if ((pOVar1 == (ON_OutlineFigurePoint *)0x0) || (tp._36_4_ == 0)) {
      this_local._4_4_ = 0.0;
    }
    else {
      Internal_OutlineFigureToPolyline::Internal_OutlineFigureToPolyline
                ((Internal_OutlineFigureToPolyline *)&default_tolerance);
      tp.m_2x_tolerance = (double)PointCallbackFunc;
      tp.m_PointCallbackFunc = (_func_void_float_float_void_ptr *)context;
      local_b8 = DefaultPolylineTolerance(this);
      if (0.0 < tolerance) {
        local_b8 = tolerance;
      }
      default_tolerance = local_b8 * 2.0;
      for (local_9c = 0; local_9c < (uint)tp._36_4_; local_9c = local_9c + 1) {
        if (tp.m_prev_point.x == 0.0) {
LAB_0064caf7:
          Internal_OutlineFigureToPolyline::AddPoint
                    ((Internal_OutlineFigureToPolyline *)&default_tolerance,pOVar1[local_9c].m_point
                    );
        }
        else if (((pOVar1[local_9c].m_point_type == QuadraticBezierPoint) &&
                 (local_9c + 1 < (uint)tp._36_4_)) &&
                (pOVar1[local_9c + 1].m_point_type == QuadraticBezierPoint)) {
          OStack_98 = (ON_2fPoint)tp.m_context;
          bez_cv[0] = pOVar1[local_9c].m_point;
          bez_cv[1] = pOVar1[local_9c + 1].m_point;
          Internal_OutlineFigureToPolyline::AddQuadraticBezier
                    ((Internal_OutlineFigureToPolyline *)&default_tolerance,&stack0xffffffffffffff68
                    );
          local_9c = local_9c + 1;
        }
        else {
          if (((pOVar1[local_9c].m_point_type != CubicBezierPoint) ||
              ((uint)tp._36_4_ <= local_9c + 2)) ||
             ((pOVar1[local_9c + 1].m_point_type != CubicBezierPoint ||
              (pOVar1[local_9c + 2].m_point_type != CubicBezierPoint)))) goto LAB_0064caf7;
          OStack_98 = (ON_2fPoint)tp.m_context;
          uVar2 = local_9c + 1;
          bez_cv[0] = pOVar1[local_9c].m_point;
          local_9c = local_9c + 2;
          bez_cv[1] = pOVar1[uVar2].m_point;
          bez_cv[2] = pOVar1[local_9c].m_point;
          Internal_OutlineFigureToPolyline::AddCubicBezier
                    ((Internal_OutlineFigureToPolyline *)&default_tolerance,&stack0xffffffffffffff68
                    );
        }
      }
      this_local._4_4_ = tp.m_prev_point.x;
    }
  }
  return (uint)this_local._4_4_;
}

Assistant:

unsigned int ON_OutlineFigure::GetPolyline(
  double tolerance, 
  void(* PointCallbackFunc)(float x, float y, void *), 
  void * context
) const
{
  if (nullptr == PointCallbackFunc)
    return 0;

  const ON_OutlineFigurePoint* a = m_points.Array();
  const unsigned int c = m_points.UnsignedCount();
  if (nullptr == a || c <= 0)
    return 0;
  
  Internal_OutlineFigureToPolyline tp;
  tp.m_PointCallbackFunc = PointCallbackFunc;
  tp.m_context = context;

  const double default_tolerance = DefaultPolylineTolerance();

  tp.m_2x_tolerance = 2.0*((tolerance > 0.0) ? tolerance : default_tolerance);

  ON_2fPoint bez_cv[4];

  for (unsigned int i = 0; i < c; i++)
  {
    if (tp.m_point_count > 0)
    {
      if (
        ON_OutlineFigurePoint::Type::QuadraticBezierPoint == a[i].m_point_type
        && i + 1 < c
        && ON_OutlineFigurePoint::Type::QuadraticBezierPoint == a[i + 1].m_point_type
        )
      {
        bez_cv[0] = tp.m_prev_point;
        bez_cv[1] = a[i++].m_point;
        bez_cv[2] = a[i].m_point;
        tp.AddQuadraticBezier(bez_cv);
        continue;
      }

      if (
        ON_OutlineFigurePoint::Type::CubicBezierPoint == a[i].m_point_type
        && i + 2 < c
        && ON_OutlineFigurePoint::Type::CubicBezierPoint == a[i + 1].m_point_type
        && ON_OutlineFigurePoint::Type::CubicBezierPoint == a[i + 2].m_point_type
        )
      {
        bez_cv[0] = tp.m_prev_point;
        bez_cv[1] = a[i++].m_point;
        bez_cv[2] = a[i++].m_point;
        bez_cv[3] = a[i].m_point;
        tp.AddCubicBezier(bez_cv);
        continue;
      }
    }

    tp.AddPoint(a[i].m_point);
  }

  return tp.m_point_count;
}